

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

Atom_p indigox::CreateAtom(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Atom_p AVar1;
  Atom *in_stack_00000010;
  Atom *in_stack_ffffffffffffffc8;
  element_type *this;
  
  this = in_RDI;
  operator_new(0x90);
  Atom::Atom(in_stack_00000010);
  std::shared_ptr<indigox::Atom>::shared_ptr<indigox::Atom,void>
            ((shared_ptr<indigox::Atom> *)this,in_stack_ffffffffffffffc8);
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Atom_p)AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p CreateAtom() { return Atom_p(new Atom()); }